

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::addDiags(EvalContext *this,Diagnostics *additional)

{
  bool bVar1;
  const_iterator pDVar2;
  undefined1 local_b0 [8];
  Diagnostic copy;
  Diagnostic *diag;
  const_iterator __end2;
  const_iterator __begin2;
  Diagnostics *__range2;
  bool first;
  Diagnostics *additional_local;
  EvalContext *this_local;
  
  bVar1 = true;
  __end2 = SmallVectorBase<slang::Diagnostic>::begin
                     ((SmallVectorBase<slang::Diagnostic> *)additional);
  pDVar2 = SmallVectorBase<slang::Diagnostic>::end((SmallVectorBase<slang::Diagnostic> *)additional)
  ;
  for (; __end2 != pDVar2; __end2 = __end2 + 1) {
    copy.symbol = (Symbol *)__end2;
    if (bVar1) {
      Diagnostic::Diagnostic((Diagnostic *)local_b0,__end2);
      reportStack(this,(Diagnostic *)local_b0);
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                ((SmallVectorBase<slang::Diagnostic> *)&this->diags,(Diagnostic *)local_b0);
      bVar1 = false;
      Diagnostic::~Diagnostic((Diagnostic *)local_b0);
    }
    else {
      SmallVectorBase<slang::Diagnostic>::push_back
                ((SmallVectorBase<slang::Diagnostic> *)&this->diags,__end2);
    }
  }
  return;
}

Assistant:

void EvalContext::addDiags(const Diagnostics& additional) {
    bool first = true;
    for (auto& diag : additional) {
        if (first) {
            Diagnostic copy = diag;
            reportStack(copy);
            diags.emplace_back(std::move(copy));
            first = false;
        }
        else {
            diags.push_back(diag);
        }
    }
}